

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleCMakePathCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool nativePath)

{
  pointer pbVar1;
  char *pcVar2;
  cmMakefile *this_00;
  char *extraout_RDX;
  char *pcVar3;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  long lVar4;
  string *path_00;
  string value;
  vector<cmsys::String,_std::allocator<cmsys::String>_> path;
  string local_70;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar4 == 0x60) {
    cmsys::SystemTools::SplitString(&path,pbVar1 + 1,':',false);
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    pcVar3 = extraout_RDX;
    for (path_00 = &(path.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                     super__Vector_impl_data._M_start)->super_string;
        path_00 !=
        &(path.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_string; path_00 = path_00 + 1) {
      if (path_00 !=
          &(path.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
            super__Vector_impl_data._M_start)->super_string) {
        std::__cxx11::string::append((char *)&value);
        pcVar3 = extraout_RDX_00;
      }
      if (nativePath) {
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_50,(cmSystemTools *)(path_00->_M_dataplus)._M_p,pcVar3);
        std::__cxx11::string::string((string *)&local_70,(string *)&local_50,0,0xffffffffffffffff);
        std::__cxx11::string::operator=((string *)path_00,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        if (((1 < path_00->_M_string_length) &&
            (pcVar3 = (path_00->_M_dataplus)._M_p, *pcVar3 == '\"')) &&
           (pcVar3[path_00->_M_string_length - 1] == '\"')) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)path_00);
          std::__cxx11::string::string((string *)&local_70,(string *)&local_50,0,0xffffffffffffffff)
          ;
          std::__cxx11::string::operator=((string *)path_00,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else {
        cmsys::SystemTools::ConvertToUnixSlashes(path_00);
      }
      std::__cxx11::string::append((string *)&value);
      pcVar3 = extraout_RDX_01;
    }
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_50);
    cmMakefile::AddDefinition(this_00,&local_70,value._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&value);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&path);
  }
  else {
    std::__cxx11::string::string
              ((string *)&value,
               "FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be called with exactly three arguments."
               ,(allocator *)&local_70);
    cmCommand::SetError(&this->super_cmCommand,&value);
    std::__cxx11::string::~string((string *)&value);
  }
  return lVar4 == 0x60;
}

Assistant:

bool cmFileCommand::HandleCMakePathCommand(std::vector<std::string>
                                           const& args,
                                           bool nativePath)
{
  std::vector<std::string>::const_iterator i = args.begin();
  if(args.size() != 3)
    {
    this->SetError("FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be "
      "called with exactly three arguments.");
    return false;
    }
  i++; // Get rid of subcommand
#if defined(_WIN32) && !defined(__CYGWIN__)
  char pathSep = ';';
#else
  char pathSep = ':';
#endif
  std::vector<cmsys::String> path = cmSystemTools::SplitString(*i,
                                                             pathSep);
  i++;
  const char* var =  i->c_str();
  std::string value;
  for(std::vector<cmsys::String>::iterator j = path.begin();
      j != path.end(); ++j)
    {
    if(j != path.begin())
      {
      value += ";";
      }
    if(!nativePath)
      {
      cmSystemTools::ConvertToUnixSlashes(*j);
      }
    else
      {
      *j = cmSystemTools::ConvertToOutputPath(j->c_str());
      // remove double quotes in the path
      cmsys::String& s = *j;

      if(s.size() > 1 && s[0] == '\"' && s[s.size()-1] == '\"')
        {
        s = s.substr(1,s.size()-2);
        }
      }
    value += *j;
    }
  this->Makefile->AddDefinition(var, value.c_str());
  return true;
}